

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.h
# Opt level: O2

void Eigen::internal::ordering_helper_at_plus_a<Eigen::SparseMatrix<double,0,int>>
               (SparseMatrix<double,_0,_int> *A,SparseMatrix<double,_0,_int> *symmat)

{
  long lVar1;
  long lVar2;
  long lVar3;
  SparseMatrix<double,_0,_int> C;
  SparseMatrix<double,_0,_int> local_80;
  SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> local_38 [8];
  SparseMatrix<double,_0,_int> *local_30;
  SparseMatrix<double,_0,_int> *local_28;
  
  SparseMatrix<double,_0,_int>::SparseMatrix(&local_80);
  local_38[0].m_isRValue = false;
  local_30 = A;
  SparseMatrix<double,0,int>::operator=((SparseMatrix<double,0,int> *)&local_80,local_38);
  for (lVar1 = 0; lVar1 < local_80.m_innerSize; lVar1 = lVar1 + 1) {
    lVar2 = (long)local_80.m_outerIndex[lVar1];
    if (local_80.m_innerNonZeros == (StorageIndex *)0x0) {
      lVar3 = (long)local_80.m_outerIndex[lVar1 + 1];
    }
    else {
      lVar3 = local_80.m_innerNonZeros[lVar1] + lVar2;
    }
    for (; lVar2 < lVar3; lVar2 = lVar2 + 1) {
      local_80.m_data.m_values[lVar2] = 0.0;
    }
  }
  local_38[0].m_isRValue = false;
  local_30 = &local_80;
  local_28 = A;
  SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)symmat,
             (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
              *)local_38);
  SparseMatrix<double,_0,_int>::~SparseMatrix(&local_80);
  return;
}

Assistant:

void ordering_helper_at_plus_a(const MatrixType& A, MatrixType& symmat)
{
  MatrixType C;
  C = A.transpose(); // NOTE: Could be  costly
  for (int i = 0; i < C.rows(); i++) 
  {
      for (typename MatrixType::InnerIterator it(C, i); it; ++it)
        it.valueRef() = 0.0;
  }
  symmat = C + A;
}